

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  Bytef BVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ulg uVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ushort uVar17;
  
  if (-1 < max_code) {
    uVar2 = (tree->dl).dad;
    uVar6 = 7;
    if (uVar2 == 0) {
      uVar6 = 0x8a;
    }
    iVar8 = (uVar2 != 0) + 3;
    uVar14 = 0;
    uVar11 = 0xffffffff;
    iVar16 = 0;
    uVar12 = (uint)uVar2;
    do {
      uVar15 = (ulong)uVar12;
      uVar2 = tree[uVar14 + 1].dl.dad;
      uVar13 = (uint)uVar2;
      iVar9 = iVar16 + 1;
      if (((int)uVar6 <= iVar9) || (uVar12 != uVar13)) {
        if (iVar9 < iVar8) {
          iVar8 = s->bi_valid;
          do {
            uVar3 = s->bl_tree[uVar15].dl.dad;
            uVar4 = s->bl_tree[uVar15].fc.freq;
            uVar17 = uVar4 << ((byte)iVar8 & 0x1f) | s->bi_buf;
            s->bi_buf = uVar17;
            if ((int)(0x10 - (uint)uVar3) < iVar8) {
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = (Bytef)uVar17;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = BVar1;
              s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
              iVar8 = (uint)uVar3 + s->bi_valid + -0x10;
            }
            else {
              iVar8 = iVar8 + (uint)uVar3;
            }
            s->bi_valid = iVar8;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        else {
          iVar8 = s->bi_valid;
          bVar7 = (byte)iVar8;
          if (uVar12 == 0) {
            if (iVar16 < 10) {
              uVar3 = s->bl_tree[0x11].dl.dad;
              uVar4 = s->bl_tree[0x11].fc.freq;
              uVar6 = (uint)s->bi_buf | (uint)uVar4 << (bVar7 & 0x1f);
              if ((int)(0x10 - (uint)uVar3) < iVar8) {
                s->bi_buf = (ush)uVar6;
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = (Bytef)uVar6;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                iVar8 = s->bi_valid + (uint)uVar3 + -0x10;
                uVar6 = (uint)(uVar4 >> (0x10U - (char)s->bi_valid & 0x1f));
              }
              else {
                iVar8 = iVar8 + (uint)uVar3;
              }
              s->bi_valid = iVar8;
              uVar10 = iVar16 + 0xfffe;
              if (iVar8 < 0xe) {
                s->bi_buf = (ushort)uVar6 | (ushort)(uVar10 << ((byte)iVar8 & 0x1f));
                iVar8 = iVar8 + 3;
              }
              else {
                uVar6 = uVar6 | uVar10 << ((byte)iVar8 & 0x1f);
                s->bi_buf = (ush)uVar6;
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = (Bytef)uVar6;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                s->bi_buf = (ush)((uVar10 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
                iVar8 = s->bi_valid + -0xd;
              }
            }
            else {
              uVar3 = s->bl_tree[0x12].dl.dad;
              uVar4 = s->bl_tree[0x12].fc.freq;
              uVar6 = (uint)s->bi_buf | (uint)uVar4 << (bVar7 & 0x1f);
              if ((int)(0x10 - (uint)uVar3) < iVar8) {
                s->bi_buf = (ush)uVar6;
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = (Bytef)uVar6;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                iVar8 = s->bi_valid + (uint)uVar3 + -0x10;
                uVar6 = (uint)(uVar4 >> (0x10U - (char)s->bi_valid & 0x1f));
              }
              else {
                iVar8 = iVar8 + (uint)uVar3;
              }
              s->bi_valid = iVar8;
              uVar10 = iVar16 + 0xfff6;
              if (iVar8 < 10) {
                s->bi_buf = (ushort)uVar6 | (ushort)(uVar10 << ((byte)iVar8 & 0x1f));
                iVar8 = iVar8 + 7;
              }
              else {
                uVar6 = uVar6 | uVar10 << ((byte)iVar8 & 0x1f);
                s->bi_buf = (ush)uVar6;
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = (Bytef)uVar6;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                s->bi_buf = (ush)((uVar10 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
                iVar8 = s->bi_valid + -9;
              }
            }
          }
          else {
            if (uVar12 != (uint)uVar11) {
              uVar3 = s->bl_tree[uVar15].dl.dad;
              uVar4 = s->bl_tree[uVar15].fc.freq;
              uVar17 = uVar4 << (bVar7 & 0x1f) | s->bi_buf;
              s->bi_buf = uVar17;
              if ((int)(0x10 - (uint)uVar3) < iVar8) {
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = (Bytef)uVar17;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
                iVar8 = s->bi_valid + (uint)uVar3 + -0x10;
              }
              else {
                iVar8 = iVar8 + (uint)uVar3;
              }
              s->bi_valid = iVar8;
              iVar9 = iVar16;
            }
            uVar3 = s->bl_tree[0x10].dl.dad;
            uVar4 = s->bl_tree[0x10].fc.freq;
            uVar17 = uVar4 << ((byte)iVar8 & 0x1f) | s->bi_buf;
            if ((int)(0x10 - (uint)uVar3) < iVar8) {
              s->bi_buf = uVar17;
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = (Bytef)uVar17;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = BVar1;
              uVar17 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
              iVar8 = s->bi_valid + (uint)uVar3 + -0x10;
            }
            else {
              iVar8 = iVar8 + (uint)uVar3;
            }
            s->bi_valid = iVar8;
            uVar6 = iVar9 + 0xfffd;
            if (iVar8 < 0xf) {
              s->bi_buf = uVar17 | (ushort)(uVar6 << ((byte)iVar8 & 0x1f));
              iVar8 = iVar8 + 2;
            }
            else {
              uVar10 = (uint)uVar17 | uVar6 << ((byte)iVar8 & 0x1f);
              s->bi_buf = (ush)uVar10;
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = (Bytef)uVar10;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = BVar1;
              s->bi_buf = (ush)((uVar6 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
              iVar8 = s->bi_valid + -0xe;
            }
          }
          s->bi_valid = iVar8;
        }
        uVar11 = uVar15;
        iVar9 = 0;
        if (uVar2 == 0) {
          uVar6 = 0x8a;
          iVar8 = 3;
        }
        else {
          iVar8 = 4 - (uint)(uVar12 == uVar13);
          uVar6 = uVar12 == uVar13 ^ 7;
        }
      }
      iVar16 = iVar9;
      uVar14 = uVar14 + 1;
      uVar12 = uVar13;
    } while (uVar14 != max_code + 1);
  }
  return;
}

Assistant:

local void send_tree (s, tree, max_code)
    deflate_state *s;
    ct_data *tree; /* the tree to be scanned */
    int max_code;       /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(s, curlen, s->bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree); send_bits(s, count-3, 2);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree); send_bits(s, count-3, 3);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree); send_bits(s, count-11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}